

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::bindFramebuffer(GLContext *this,deUint32 target,deUint32 framebuffer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  code *pcVar5;
  GLuint framebuffer_00;
  deBool dVar6;
  int iVar7;
  TestError *this_00;
  undefined4 extraout_var;
  int *piVar8;
  undefined4 extraout_var_00;
  bool bVar9;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar10;
  undefined1 local_48 [8];
  IVec2 offset;
  bool isValidTarget;
  GLuint local_18;
  deUint32 defaultFbo;
  deUint32 framebuffer_local;
  deUint32 target_local;
  GLContext *this_local;
  
  local_18 = framebuffer;
  defaultFbo = target;
  _framebuffer_local = this;
  framebuffer_00 = (*this->m_context->_vptr_RenderContext[6])();
  while( true ) {
    dVar6 = ::deGetFalse();
    if ((dVar6 != 0) || ((local_18 != 0 && (local_18 == framebuffer_00)))) break;
    dVar6 = ::deGetFalse();
    if (dVar6 == 0) {
      bVar9 = true;
      if ((defaultFbo != 0x8d40) && (bVar9 = true, defaultFbo != 0x8ca9)) {
        bVar9 = defaultFbo == 0x8ca8;
      }
      if ((bVar9) && (local_18 != 0)) {
        pVar10 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 insert(&this->m_allocatedFbos,&local_18);
        offset.m_data = (int  [2])pVar10.first._M_node;
      }
      if ((defaultFbo == 0x8d40) || (defaultFbo == 0x8ca8)) {
        this->m_readFramebufferBinding = local_18;
      }
      if ((defaultFbo == 0x8d40) || (defaultFbo == 0x8ca9)) {
        this->m_drawFramebufferBinding = local_18;
      }
      if (local_18 == 0) {
        glu::CallLogWrapper::glBindFramebuffer(this->m_wrapper,defaultFbo,framebuffer_00);
      }
      else {
        glu::CallLogWrapper::glBindFramebuffer(this->m_wrapper,defaultFbo,local_18);
      }
      if ((defaultFbo == 0x8d40) || (defaultFbo == 0x8ca9)) {
        getDrawOffset((GLContext *)local_48);
        iVar7 = (*this->m_context->_vptr_RenderContext[3])();
        pcVar5 = *(code **)(CONCAT44(extraout_var,iVar7) + 0x1a00);
        piVar8 = tcu::Vector<int,_4>::x(&this->m_curViewport);
        iVar7 = *piVar8;
        piVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_48);
        iVar1 = *piVar8;
        piVar8 = tcu::Vector<int,_4>::y(&this->m_curViewport);
        iVar2 = *piVar8;
        piVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_48);
        iVar3 = *piVar8;
        piVar8 = tcu::Vector<int,_4>::z(&this->m_curViewport);
        iVar4 = *piVar8;
        piVar8 = tcu::Vector<int,_4>::w(&this->m_curViewport);
        (*pcVar5)(iVar7 + iVar1,iVar2 + iVar3,iVar4,*piVar8);
        iVar7 = (*this->m_context->_vptr_RenderContext[3])();
        pcVar5 = *(code **)(CONCAT44(extraout_var_00,iVar7) + 0x1290);
        piVar8 = tcu::Vector<int,_4>::x(&this->m_curScissor);
        iVar7 = *piVar8;
        piVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_48);
        iVar1 = *piVar8;
        piVar8 = tcu::Vector<int,_4>::y(&this->m_curScissor);
        iVar2 = *piVar8;
        piVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_48);
        iVar3 = *piVar8;
        piVar8 = tcu::Vector<int,_4>::z(&this->m_curScissor);
        iVar4 = *piVar8;
        piVar8 = tcu::Vector<int,_4>::w(&this->m_curScissor);
        (*pcVar5)(iVar7 + iVar1,iVar2 + iVar3,iVar4,*piVar8);
      }
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"framebuffer == 0 || framebuffer != defaultFbo",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrGLContext.cpp"
             ,0xc6);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GLContext::bindFramebuffer (deUint32 target, deUint32 framebuffer)
{
	// \todo [2011-10-13 pyry] This is a bit of a hack since test cases assumes 0 default fbo.
	deUint32 defaultFbo = m_context.getDefaultFramebuffer();
	TCU_CHECK(framebuffer == 0 || framebuffer != defaultFbo);

	bool isValidTarget = target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER || target == GL_READ_FRAMEBUFFER;

	if (isValidTarget && framebuffer != 0)
		m_allocatedFbos.insert(framebuffer);

	// Update bindings.
	if (target == GL_FRAMEBUFFER || target == GL_READ_FRAMEBUFFER)
		m_readFramebufferBinding = framebuffer;

	if (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER)
		m_drawFramebufferBinding = framebuffer;

	if (framebuffer == 0) // Redirect 0 to platform-defined default framebuffer.
		m_wrapper->glBindFramebuffer(target, defaultFbo);
	else
		m_wrapper->glBindFramebuffer(target, framebuffer);

	// Update viewport and scissor if we updated draw framebuffer binding \note Not logged for clarity
	if (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER)
	{
		tcu::IVec2 offset = getDrawOffset();
		m_context.getFunctions().viewport(m_curViewport.x()+offset.x(), m_curViewport.y()+offset.y(), m_curViewport.z(), m_curViewport.w());
		m_context.getFunctions().scissor(m_curScissor.x()+offset.x(), m_curScissor.y()+offset.y(), m_curScissor.z(), m_curScissor.w());
	}
}